

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_15e445::HelpPrinter::printHelp(HelpPrinter *this)

{
  uint *puVar1;
  void **ppvVar2;
  char *pcVar3;
  long lVar4;
  StringRef *pSVar5;
  StringRef Str;
  atomic<void_*> aVar6;
  void **ppvVar7;
  void *pvVar8;
  raw_ostream *prVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  uint *puVar13;
  code *__n;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  StringRef *pSVar19;
  StringRef SVar20;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  StringRef Str_16;
  StringRef Str_17;
  StringRef Str_18;
  iterator __begin1;
  StrSubCommandPairVector Subs;
  StrOptionPairVector Opts;
  SmallPtrSetIteratorImpl local_1078;
  SmallPtrSetIteratorImpl local_1068;
  HelpPrinter *local_1058;
  SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true> local_1050;
  undefined1 local_1040 [2048];
  SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> local_840;
  undefined1 local_830 [2048];
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  pSVar19 = *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x128);
  local_840.super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
  super_SmallVectorBase.BeginX = local_830;
  local_840.super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
  super_SmallVectorBase.Size = 0;
  local_840.super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  sortOpts((StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)(pSVar19 + 8),&local_840,
           this->ShowHidden);
  local_1050.super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.BeginX = local_1040;
  local_1050.super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.Size = 0;
  local_1050.super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  aVar6._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  local_1068.Bucket = *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xf0);
  puVar1 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xfc);
  puVar15 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xf8);
  puVar13 = puVar15;
  if (local_1068.Bucket ==
      *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xe8)) {
    puVar13 = puVar1;
  }
  local_1068.End = local_1068.Bucket + *puVar13;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_1068);
  local_1078.Bucket = local_1068.Bucket;
  local_1078.End = local_1068.End;
  lVar16 = *(long *)((long)aVar6._M_b._M_p + 0xf0);
  if (lVar16 == *(long *)((long)aVar6._M_b._M_p + 0xe8)) {
    puVar15 = puVar1;
  }
  __n = (code *)(ulong)*puVar15;
  local_1068.Bucket = (void **)(lVar16 + (long)__n * 8);
  local_1068.End = local_1068.Bucket;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_1068);
  ppvVar7 = local_1068.Bucket;
  if (local_1078.Bucket != local_1068.Bucket) {
    do {
      if (local_1078.End <= local_1078.Bucket) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      ppvVar2 = (void **)*local_1078.Bucket;
      if (ppvVar2[1] != (void *)0x0) {
        __n = (code *)*ppvVar2;
        local_1068.Bucket = (void **)__n;
        local_1068.End = ppvVar2;
        llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>::
        push_back(&local_1050,(pair<const_char_*,_llvm::cl::SubCommand_*> *)&local_1068);
      }
      local_1078.Bucket = local_1078.Bucket + 1;
      llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_1078);
    } while (local_1078.Bucket != ppvVar7);
  }
  if (1 < (local_1050.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff)) {
    __n = SubNameCompare;
    qsort(local_1050.
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
          super_SmallVectorBase.BeginX,
          local_1050.
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
          super_SmallVectorBase._8_8_ & 0xffffffff,0x10,SubNameCompare);
  }
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  if (*(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x28) != 0) {
    prVar9 = llvm::outs();
    SVar20.Length = 10;
    SVar20.Data = "OVERVIEW: ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,SVar20);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar9 = llvm::raw_ostream::operator<<
                       (prVar9,*(StringRef *)
                                ((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x20));
    Str_00.Length = 1;
    Str_00.Data = "\n";
    llvm::raw_ostream::operator<<(prVar9,Str_00);
  }
  if (llvm::cl::TopLevelSubCommand == (StringRef *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&llvm::cl::TopLevelSubCommand,
               llvm::object_creator<llvm::cl::SubCommand>::call,
               llvm::object_deleter<llvm::cl::SubCommand>::call);
  }
  local_1058 = this;
  if (pSVar19 == llvm::cl::TopLevelSubCommand) {
    prVar9 = llvm::outs();
    Str_06.Length = 7;
    Str_06.Data = "USAGE: ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_06);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    llvm::raw_ostream::write
              (prVar9,(int)*(undefined8 *)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
               *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 8),(size_t)__n)
    ;
    if (2 < local_1050.
            super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
            super_SmallVectorBase.Size) {
      prVar9 = llvm::outs();
      Str_07.Length = 0xd;
      Str_07.Data = " [subcommand]";
      llvm::raw_ostream::operator<<(prVar9,Str_07);
    }
    prVar9 = llvm::outs();
  }
  else {
    if (pSVar19[1].Length != 0) {
      prVar9 = llvm::outs();
      Str_01.Length = 0xc;
      Str_01.Data = "SUBCOMMAND \'";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_01);
      prVar9 = llvm::raw_ostream::operator<<(prVar9,*pSVar19);
      Str_02.Length = 3;
      Str_02.Data = "\': ";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_02);
      prVar9 = llvm::raw_ostream::operator<<(prVar9,pSVar19[1]);
      Str_03.Length = 2;
      Str_03.Data = "\n\n";
      llvm::raw_ostream::operator<<(prVar9,Str_03);
    }
    prVar9 = llvm::outs();
    Str_04.Length = 7;
    Str_04.Data = "USAGE: ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_04);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar9 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar9,(int)*(undefined8 *)
                                     GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
                        *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 8),
                        (size_t)__n);
    Str_05.Length = 1;
    Str_05.Data = " ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_05);
    prVar9 = llvm::raw_ostream::operator<<(prVar9,*pSVar19);
  }
  Str_08.Length = 10;
  Str_08.Data = " [options]";
  llvm::raw_ostream::operator<<(prVar9,Str_08);
  uVar14 = (ulong)(uint)pSVar19[2].Length;
  if (uVar14 != 0) {
    pcVar3 = pSVar19[2].Data;
    lVar16 = 0;
    do {
      lVar4 = *(long *)(pcVar3 + lVar16);
      if (*(long *)(lVar4 + 0x20) != 0) {
        prVar9 = llvm::outs();
        Str_09.Length = 3;
        Str_09.Data = " --";
        prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_09);
        llvm::raw_ostream::operator<<(prVar9,*(StringRef *)(lVar4 + 0x18));
      }
      prVar9 = llvm::outs();
      Str_10.Length = 1;
      Str_10.Data = " ";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_10);
      llvm::raw_ostream::operator<<(prVar9,*(StringRef *)(lVar4 + 0x28));
      lVar16 = lVar16 + 8;
    } while (uVar14 << 3 != lVar16);
  }
  if (pSVar19[10].Data != (char *)0x0) {
    prVar9 = llvm::outs();
    Str_11.Length = 1;
    Str_11.Data = " ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_11);
    __n = (code *)pSVar19[10].Data;
    Str.Data = *(char **)((long)__n + 0x28);
    Str.Length = *(size_t *)((long)__n + 0x30);
    llvm::raw_ostream::operator<<(prVar9,Str);
  }
  if (llvm::cl::TopLevelSubCommand == (StringRef *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&llvm::cl::TopLevelSubCommand,
               llvm::object_creator<llvm::cl::SubCommand>::call,
               llvm::object_deleter<llvm::cl::SubCommand>::call);
  }
  pvVar8 = local_1050.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
           super_SmallVectorBase.BeginX;
  if ((pSVar19 == llvm::cl::TopLevelSubCommand) &&
     (uVar14 = local_1050.
               super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>
               .super_SmallVectorBase._8_8_ & 0xffffffff, uVar14 != 0)) {
    lVar16 = 0;
    uVar18 = 0;
    do {
      sVar10 = strlen(*(char **)((long)pvVar8 + lVar16));
      if (sVar10 < uVar18) {
        sVar10 = uVar18;
      }
      lVar16 = lVar16 + 0x10;
      uVar18 = sVar10;
    } while (uVar14 << 4 != lVar16);
    prVar9 = llvm::outs();
    Str_12.Length = 2;
    Str_12.Data = "\n\n";
    llvm::raw_ostream::operator<<(prVar9,Str_12);
    prVar9 = llvm::outs();
    Str_13.Length = 0xe;
    Str_13.Data = "SUBCOMMANDS:\n\n";
    llvm::raw_ostream::operator<<(prVar9,Str_13);
    pvVar8 = local_1050.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase.BeginX;
    uVar14 = local_1050.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase._8_8_ & 0xffffffff;
    if (uVar14 != 0) {
      lVar16 = 0;
      do {
        prVar9 = llvm::outs();
        pcVar3 = prVar9->OutBufCur;
        if ((ulong)((long)prVar9->OutBufEnd - (long)pcVar3) < 2) {
          prVar9 = (raw_ostream *)
                   llvm::raw_ostream::write(prVar9,0x19f097,(void *)0x2,(size_t)pcVar3);
        }
        else {
          pcVar3[0] = ' ';
          pcVar3[1] = ' ';
          prVar9->OutBufCur = prVar9->OutBufCur + 2;
        }
        llvm::raw_ostream::operator<<(prVar9,*(char **)((long)pvVar8 + lVar16));
        if (*(long *)(*(long *)((long)pvVar8 + lVar16 + 8) + 0x18) != 0) {
          prVar9 = llvm::outs();
          sVar11 = strlen(*(char **)((long)pvVar8 + lVar16));
          llvm::raw_ostream::indent(prVar9,(int)sVar10 - (int)sVar11);
          prVar9 = llvm::outs();
          pcVar3 = prVar9->OutBufCur;
          if ((ulong)((long)prVar9->OutBufEnd - (long)pcVar3) < 3) {
            prVar9 = (raw_ostream *)
                     llvm::raw_ostream::write(prVar9,0x19d040,(void *)0x3,(size_t)pcVar3);
          }
          else {
            pcVar3[2] = ' ';
            pcVar3[0] = ' ';
            pcVar3[1] = '-';
            prVar9->OutBufCur = prVar9->OutBufCur + 3;
          }
          llvm::raw_ostream::operator<<
                    (prVar9,*(StringRef *)(*(long *)((long)pvVar8 + lVar16 + 8) + 0x10));
        }
        prVar9 = llvm::outs();
        __n = (code *)prVar9->OutBufCur;
        if ((code *)prVar9->OutBufEnd == __n) {
          llvm::raw_ostream::write(prVar9,0x19a9ea,(void *)0x1,(size_t)__n);
        }
        else {
          *__n = (code)0xa;
          prVar9->OutBufCur = prVar9->OutBufCur + 1;
        }
        lVar16 = lVar16 + 0x10;
      } while (uVar14 << 4 != lVar16);
    }
    prVar9 = llvm::outs();
    Str_14.Length = 1;
    Str_14.Data = "\n";
    llvm::raw_ostream::operator<<(prVar9,Str_14);
    prVar9 = llvm::outs();
    Str_15.Length = 8;
    Str_15.Data = "  Type \"";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_15);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar9 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar9,(int)*(undefined8 *)
                                     GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
                        *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 8),
                        (size_t)__n);
    Str_16.Length = 0x3e;
    Str_16.Data = " <subcommand> -help\" to get more help on a specific subcommand";
    llvm::raw_ostream::operator<<(prVar9,Str_16);
  }
  prVar9 = llvm::outs();
  Str_17.Length = 2;
  Str_17.Data = "\n\n";
  llvm::raw_ostream::operator<<(prVar9,Str_17);
  uVar14 = local_840.
           super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff;
  if (uVar14 == 0) {
    uVar18 = 0;
  }
  else {
    lVar16 = 8;
    uVar17 = 0;
    uVar18 = 0;
    do {
      if ((local_840.
           super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff) <= uVar17) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::Option *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::Option *>]"
                     );
      }
      uVar12 = (**(code **)(**(long **)((long)local_840.
                                              super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>
                                              .
                                              super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                                              .super_SmallVectorBase.BeginX + lVar16) + 0x28))();
      if (uVar12 < uVar18) {
        uVar12 = uVar18;
      }
      uVar18 = uVar12;
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar14 != uVar17);
  }
  prVar9 = llvm::outs();
  Str_18.Length = 9;
  Str_18.Data = "OPTIONS:\n";
  llvm::raw_ostream::operator<<(prVar9,Str_18);
  (**local_1058->_vptr_HelpPrinter)(local_1058,&local_840,uVar18);
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  pSVar5 = *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38);
  for (pSVar19 = *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30);
      pSVar19 != pSVar5; pSVar19 = pSVar19 + 1) {
    SVar20 = *pSVar19;
    prVar9 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar9,SVar20);
  }
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  if (*(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38) !=
      *(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30)) {
    *(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38) =
         *(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30);
  }
  if ((undefined1 *)
      local_1050.
      super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
      super_SmallVectorBase.BeginX != local_1040) {
    free(local_1050.
         super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
         super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_840.super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
      super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
      super_SmallVectorBase.BeginX != local_830) {
    free(local_840.super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
         super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
         super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void printHelp() {
    SubCommand *Sub = GlobalParser->getActiveSubCommand();
    auto &OptionsMap = Sub->OptionsMap;
    auto &PositionalOpts = Sub->PositionalOpts;
    auto &ConsumeAfterOpt = Sub->ConsumeAfterOpt;

    StrOptionPairVector Opts;
    sortOpts(OptionsMap, Opts, ShowHidden);

    StrSubCommandPairVector Subs;
    sortSubCommands(GlobalParser->RegisteredSubCommands, Subs);

    if (!GlobalParser->ProgramOverview.empty())
      outs() << "OVERVIEW: " << GlobalParser->ProgramOverview << "\n";

    if (Sub == &*TopLevelSubCommand) {
      outs() << "USAGE: " << GlobalParser->ProgramName;
      if (Subs.size() > 2)
        outs() << " [subcommand]";
      outs() << " [options]";
    } else {
      if (!Sub->getDescription().empty()) {
        outs() << "SUBCOMMAND '" << Sub->getName()
               << "': " << Sub->getDescription() << "\n\n";
      }
      outs() << "USAGE: " << GlobalParser->ProgramName << " " << Sub->getName()
             << " [options]";
    }

    for (auto Opt : PositionalOpts) {
      if (Opt->hasArgStr())
        outs() << " --" << Opt->ArgStr;
      outs() << " " << Opt->HelpStr;
    }

    // Print the consume after option info if it exists...
    if (ConsumeAfterOpt)
      outs() << " " << ConsumeAfterOpt->HelpStr;

    if (Sub == &*TopLevelSubCommand && !Subs.empty()) {
      // Compute the maximum subcommand length...
      size_t MaxSubLen = 0;
      for (size_t i = 0, e = Subs.size(); i != e; ++i)
        MaxSubLen = std::max(MaxSubLen, strlen(Subs[i].first));

      outs() << "\n\n";
      outs() << "SUBCOMMANDS:\n\n";
      printSubCommands(Subs, MaxSubLen);
      outs() << "\n";
      outs() << "  Type \"" << GlobalParser->ProgramName
             << " <subcommand> -help\" to get more help on a specific "
                "subcommand";
    }

    outs() << "\n\n";

    // Compute the maximum argument length...
    size_t MaxArgLen = 0;
    for (size_t i = 0, e = Opts.size(); i != e; ++i)
      MaxArgLen = std::max(MaxArgLen, Opts[i].second->getOptionWidth());

    outs() << "OPTIONS:\n";
    printOptions(Opts, MaxArgLen);

    // Print any extra help the user has declared.
    for (auto I : GlobalParser->MoreHelp)
      outs() << I;
    GlobalParser->MoreHelp.clear();
  }